

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

QString * styleStringHelper(QString *__return_storage_ptr__,int weight,Style style)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QStringBuilder<char16_t,_QString> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  if (weight < 0x191) {
    if (weight < 0x65) {
      pcVar5 = "Thin";
      goto LAB_00427a81;
    }
    if ((uint)weight < 0xc9) {
      pcVar5 = "Extra Light";
      goto LAB_00427a81;
    }
    if ((uint)weight < 0x12d) {
      pcVar5 = "Light";
      goto LAB_00427a81;
    }
  }
  else {
    if ((uint)weight < 900) {
      if (799 < (uint)weight) {
        pcVar5 = "Extra Bold";
        goto LAB_00427a81;
      }
      if (699 < (uint)weight) {
        pcVar5 = "Bold";
        goto LAB_00427a81;
      }
      if (599 < (uint)weight) {
        pcVar5 = "Demi Bold";
        goto LAB_00427a81;
      }
      if ((uint)weight < 500) goto LAB_00427aba;
      pcVar5 = "Medium";
      iVar4 = 0x5f67cb;
    }
    else {
      pcVar5 = "Black";
LAB_00427a81:
      iVar4 = 0;
    }
    QCoreApplication::translate((char *)&local_68,"QFontDatabase",pcVar5,iVar4);
    local_48.ptr = (char16_t *)local_68.b.d.d;
    local_48.d = (Data *)local_68._0_8_;
    local_68._0_8_ = (Data *)0x0;
    local_68.b.d.d = (Data *)0x0;
    local_48.size = (qsizetype)local_68.b.d.ptr;
    local_68.b.d.ptr = (char16_t *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
LAB_00427aba:
  if (style == StyleOblique) {
    pcVar5 = "Oblique";
  }
  else {
    if (style != StyleItalic) goto LAB_00427b3a;
    pcVar5 = "Italic";
  }
  QCoreApplication::translate((char *)&local_88,"QFontDatabase",pcVar5,0);
  local_68.b.d.size = local_88.size;
  local_68.b.d.ptr = local_88.ptr;
  local_68.b.d.d = local_88.d;
  local_68.a = 0x20;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  operator+=((QString *)&local_48,&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
LAB_00427b3a:
  if ((char16_t *)local_48.size == (char16_t *)0x0) {
    QCoreApplication::translate((char *)&local_68,"QFontDatabase","Normal",0x5f6798);
    qVar3 = local_48.size;
    pcVar2 = local_48.ptr;
    pDVar1 = local_48.d;
    local_48.d = (Data *)local_68._0_8_;
    local_48.ptr = (char16_t *)local_68.b.d.d;
    local_68._0_8_ = pDVar1;
    local_68.b.d.d = (Data *)pcVar2;
    local_48.size = (qsizetype)local_68.b.d.ptr;
    local_68.b.d.ptr = (char16_t *)qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  }
  QString::simplified_helper((QString *)__return_storage_ptr__);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString styleStringHelper(int weight, QFont::Style style)
{
    QString result;
    if (weight > QFont::Normal) {
        if (weight >= QFont::Black)
            result = QCoreApplication::translate("QFontDatabase", "Black");
        else if (weight >= QFont::ExtraBold)
            result = QCoreApplication::translate("QFontDatabase", "Extra Bold");
        else if (weight >= QFont::Bold)
            result = QCoreApplication::translate("QFontDatabase", "Bold");
        else if (weight >= QFont::DemiBold)
            result = QCoreApplication::translate("QFontDatabase", "Demi Bold");
        else if (weight >= QFont::Medium)
            result = QCoreApplication::translate("QFontDatabase", "Medium", "The Medium font weight");
    } else {
        if (weight <= QFont::Thin)
            result = QCoreApplication::translate("QFontDatabase", "Thin");
        else if (weight <= QFont::ExtraLight)
            result = QCoreApplication::translate("QFontDatabase", "Extra Light");
        else if (weight <= QFont::Light)
            result = QCoreApplication::translate("QFontDatabase", "Light");
    }

    if (style == QFont::StyleItalic)
        result += u' ' + QCoreApplication::translate("QFontDatabase", "Italic");
    else if (style == QFont::StyleOblique)
        result += u' ' + QCoreApplication::translate("QFontDatabase", "Oblique");

    if (result.isEmpty())
        result = QCoreApplication::translate("QFontDatabase", "Normal", "The Normal or Regular font weight");

    return result.simplified();
}